

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::getLowerPointer
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,size_t depth)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  unsigned_long uVar9;
  size_type *psVar10;
  char cVar11;
  ulong uVar12;
  string __str;
  ulong *local_a0;
  uint local_98;
  undefined4 uStack_94;
  ulong local_90 [2];
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (depth == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
    return __return_storage_ptr__;
  }
  std::operator+(&local_40,"lowerptr_",rel_name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_50 = *puVar8;
    lStack_48 = plVar6[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar8;
    local_60 = (ulong *)*plVar6;
  }
  local_58 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar11 = '\x01';
  if (10 < depth) {
    uVar9 = depth - 1;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (uVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_002903d2;
      }
      if (uVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_002903d2;
      }
      if (uVar9 < 10000) goto LAB_002903d2;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar3);
    cVar11 = cVar11 + '\x01';
  }
LAB_002903d2:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a0,local_98,depth - 1);
  uVar2 = CONCAT44(uStack_94,local_98) + local_58;
  uVar12 = 0xf;
  if (local_60 != &local_50) {
    uVar12 = local_50;
  }
  if (uVar12 < uVar2) {
    uVar12 = 0xf;
    if (local_a0 != local_90) {
      uVar12 = local_90[0];
    }
    if (uVar2 <= uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_60);
      goto LAB_00290456;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a0);
LAB_00290456:
  local_80 = &local_70;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar7[3];
  }
  else {
    local_70 = *puVar1;
    local_80 = (undefined8 *)*puVar7;
  }
  local_78 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar4 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::getLowerPointer(const std::string rel_name, size_t depth)
{
    if (depth == 0)
        return "0";
    return "lowerptr_"+rel_name+"["+std::to_string(depth-1)+"]";
}